

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# road_network.cpp
# Opt level: O2

vector<node_type,_std::allocator<node_type>_> * __thiscall
road_network::get_predecessors
          (vector<node_type,_std::allocator<node_type>_> *__return_storage_ptr__,road_network *this,
          node_type node)

{
  undefined8 in_RAX;
  undefined3 in_register_00000011;
  long *plVar1;
  long *plVar2;
  undefined8 uStack_28;
  
  (__return_storage_ptr__->super__Vector_base<node_type,_std::allocator<node_type>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<node_type,_std::allocator<node_type>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<node_type,_std::allocator<node_type>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  plVar2 = (long *)((long)&(((this->_g).super_type.m_vertices.
                             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::listS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::listS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                             ._M_impl.super__Vector_impl_data._M_start)->super_StoredVertex).
                           m_out_edges.
                           super__List_base<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
                   + (ulong)(uint)(CONCAT31(in_register_00000011,node) << 5));
  plVar1 = plVar2;
  uStack_28 = in_RAX;
  while (plVar1 = (long *)*plVar1, plVar1 != plVar2) {
    uStack_28 = CONCAT17(*(undefined1 *)(plVar1 + 2),(undefined7)uStack_28);
    std::vector<node_type,_std::allocator<node_type>_>::emplace_back<node_type>
              (__return_storage_ptr__,(node_type *)((long)&uStack_28 + 7));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<node_type> road_network::get_predecessors(node_type node)
{
    std::vector<node_type> pre;
    graph::vertex_descriptor start = boost::vertex(node, _g);

    for (auto vd : boost::make_iterator_range(boost::adjacent_vertices(start, _g))) 
    {
        pre.push_back(static_cast<node_type>(vd));
    }
    return pre;
}